

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

bool CheckFunctionCompatiblity(FScriptPosition *ScriptPosition,PFunction *caller,PFunction *callee)

{
  Variant *pVVar1;
  Variant *pVVar2;
  bool bVar3;
  PClass *ti;
  PClass *this;
  char *message;
  
  pVVar1 = (callee->Variants).Array;
  if ((pVVar1->Flags & 2) == 0) {
    return true;
  }
  pVVar2 = (caller->Variants).Array;
  if ((pVVar2->UseFlags & ~pVVar1->UseFlags) == 0) {
    if ((pVVar2->Flags & 2) == 0) {
      message = "Call to non-static function %s from a static context";
    }
    else {
      if (pVVar2->SelfClass == pVVar1->SelfClass) {
        return true;
      }
      ti = dyn_cast<PClass>((DObject *)pVVar2->SelfClass);
      this = dyn_cast<PClass>((DObject *)((callee->Variants).Array)->SelfClass);
      message = "Call to member function %s with incompatible self pointer.";
      if (((ti != (PClass *)0x0) && (this != (PClass *)0x0)) &&
         (bVar3 = PClass::IsAncestorOf(this,ti), bVar3)) {
        return true;
      }
    }
  }
  else {
    message = "Function %s incompatible with current context\n";
  }
  FScriptPosition::Message
            (ScriptPosition,2,message,
             FName::NameData.NameArray
             [*(int *)&(callee->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text);
  return false;
}

Assistant:

void ExpEmit::Reuse(VMFunctionBuilder *build)
{
	if (!Fixed && !Konst)
	{
		assert(RegCount == 1);
		bool success = build->Registers[RegType].Reuse(RegNum);
		assert(success && "Attempt to reuse a register that is already in use");
	}
}